

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<long_double>::TPZFileEqnStorage
          (TPZFileEqnStorage<long_double> *this,TPZFileEqnStorage<long_double> *param_2)

{
  FILE *pFVar1;
  TPZRegisterClassId *in_RDI;
  int zero;
  int fdtmp;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_34;
  int local_30;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0;
  local_20 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZFileEqnStorage<long_double>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_025412d0);
  *(undefined ***)in_RDI = &PTR__TPZFileEqnStorage_02541280;
  TPZStack<long,_10>::TPZStack
            ((TPZStack<long,_10> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  std::__cxx11::string::string((string *)(in_RDI + 0x80));
  strcpy(filenamestorage,"/tmp/binary_frontalXXXXXX");
  local_30 = 0xffffffff;
  local_30 = mkstemp(filenamestorage);
  *(undefined4 *)(in_RDI + 0xac) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  *(undefined4 *)(in_RDI + 8) = 0x14;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x80),filenamestorage);
  pFVar1 = fdopen(local_30,"wb");
  *(FILE **)(in_RDI + 0xa0) = pFVar1;
  local_34 = 0;
  fwrite(in_RDI + 8,4,1,*(FILE **)(in_RDI + 0xa0));
  fwrite(&local_34,4,1,*(FILE **)(in_RDI + 0xa0));
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::TPZFileEqnStorage(const TPZFileEqnStorage &)
: TPZRegisterClassId(&TPZFileEqnStorage<TVar>::ClassId)
{
	strcpy(filenamestorage, "/tmp/binary_frontalXXXXXX");
#ifdef WIN32
	_mktemp(filenamestorage);
#else
	int fdtmp = -1;
	fdtmp = mkstemp(filenamestorage); //returns file description for tmp file
#endif
	
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=20;
	
	fFileName = filenamestorage;
#ifdef WIN32
	fIOStream = fopen(filenamestorage,"wb"); //open for writing
#else
	fIOStream = fdopen(fdtmp,"wb"); //open for writing
#endif
	/**
	 *Writes NumHeaders and NumBlocks information in
	 *the two initial positions on fIOStream
	 */
	int zero = 0;
	fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
	//cout << ftell(fIOStream) << endl;
	fwrite(&zero,sizeof(int),1,fIOStream);
}